

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall string_string_utf8_Test::TestBody(string_string_utf8_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char32_t *right;
  AssertHelper local_230;
  Message local_228;
  int local_220 [2];
  undefined1 local_218 [8];
  AssertionResult gtest_ar_7;
  Message local_200;
  size_t local_1f8;
  uint local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_6;
  char32_t local_1b4;
  char32_t empty_data [1];
  Message local_1a8;
  int local_1a0 [2];
  undefined1 local_198 [8];
  AssertionResult gtest_ar_5;
  Message local_180;
  size_t local_178;
  uint local_16c;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_4;
  string empty;
  Message local_130;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_3;
  string to_utf8;
  Message local_f0;
  int local_e8 [2];
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  utf32_buffer unicode;
  Message local_88;
  size_t local_80;
  size_t local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_58 [3];
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  string from_utf8;
  string_string_utf8_Test *this_local;
  
  ST::string::from_utf8
            ((string *)&gtest_ar.message_,utf8_test_data,0xffffffffffffffff,check_validity);
  pcVar2 = ST::string::c_str((string *)&gtest_ar.message_);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_40,"utf8_test_data","from_utf8.c_str()",utf8_test_data,pcVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0xfd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_78 = text_size<char,29ul>(&utf8_test_data);
  local_80 = ST::string::size((string *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_70,"text_size(utf8_test_data)","from_utf8.size()",&local_78,&local_80
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(unicode.m_data + 10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0xfe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)(unicode.m_data + 10),&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(unicode.m_data + 10));
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  ST::string::to_utf32((utf32_buffer *)&gtest_ar_2.message_,(string *)&gtest_ar.message_);
  local_e8[1] = 0;
  right = ST::buffer<char32_t>::data((buffer<char32_t> *)&gtest_ar_2.message_);
  local_e8[0] = T_strcmp<char32_t>(L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",right);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_e0,"0","T_strcmp(test_data, unicode.data())",local_e8 + 1,local_e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(to_utf8.m_buffer.m_data + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x100,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(to_utf8.m_buffer.m_data + 8),&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(to_utf8.m_buffer.m_data + 8));
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  ST::string::from_utf32
            ((string *)&gtest_ar_3.message_,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",
             0xffffffffffffffff,check_validity);
  pcVar2 = ST::string::c_str((string *)&gtest_ar_3.message_);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_128,"utf8_test_data","to_utf8.c_str()",utf8_test_data,pcVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(empty.m_buffer.m_data + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x104,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(empty.m_buffer.m_data + 8),&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(empty.m_buffer.m_data + 8));
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  ST::string::from_utf8((string *)&gtest_ar_4.message_,"",0xffffffffffffffff,check_validity);
  local_16c = 0;
  local_178 = ST::string::size((string *)&gtest_ar_4.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_168,"0U","empty.size()",&local_16c,&local_178);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x108,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  local_1a0[1] = 0;
  pcVar2 = ST::string::c_str((string *)&gtest_ar_4.message_);
  local_1a0[0] = T_strcmp<char>(pcVar2,"");
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_198,"0","T_strcmp(empty.c_str(), \"\")",local_1a0 + 1,local_1a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffe50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x109,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffe50,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffe50);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  local_1b4 = L'\0';
  ST::string::from_utf32
            ((string *)&gtest_ar_6.message_,&local_1b4,0xffffffffffffffff,check_validity);
  ST::string::operator=((string *)&gtest_ar_4.message_,(string *)&gtest_ar_6.message_);
  ST::string::~string((string *)&gtest_ar_6.message_);
  local_1ec = 0;
  local_1f8 = ST::string::size((string *)&gtest_ar_4.message_);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_1e8,"0U","empty.size()",&local_1ec,&local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x10d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  local_220[1] = 0;
  pcVar2 = ST::string::c_str((string *)&gtest_ar_4.message_);
  local_220[0] = T_strcmp<char>(pcVar2,"");
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_218,"0","T_strcmp(empty.c_str(), \"\")",local_220 + 1,local_220);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x10e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  ST::string::~string((string *)&gtest_ar_4.message_);
  ST::string::~string((string *)&gtest_ar_3.message_);
  ST::buffer<char32_t>::~buffer((buffer<char32_t> *)&gtest_ar_2.message_);
  ST::string::~string((string *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(string, string_utf8)
{
    // From UTF-8 to ST::string
    ST::string from_utf8 = ST::string::from_utf8(utf8_test_data);
    EXPECT_STREQ(utf8_test_data, from_utf8.c_str());
    EXPECT_EQ(text_size(utf8_test_data), from_utf8.size());
    ST::utf32_buffer unicode = from_utf8.to_utf32();
    EXPECT_EQ(0, T_strcmp(test_data, unicode.data()));

    // From ST::string to UTF-8
    ST::string to_utf8 = ST::string::from_utf32(test_data);
    EXPECT_STREQ(utf8_test_data, to_utf8.c_str());

    // Empty strings
    ST::string empty = ST::string::from_utf8("");
    EXPECT_EQ(0U, empty.size());
    EXPECT_EQ(0, T_strcmp(empty.c_str(), ""));

    const char32_t empty_data[] = { 0 };
    empty = ST::string::from_utf32(empty_data);
    EXPECT_EQ(0U, empty.size());
    EXPECT_EQ(0, T_strcmp(empty.c_str(), ""));
}